

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_tree.h
# Opt level: O0

bool __thiscall
expression_tree::detail::
default_branch<float,_expression_tree::no_caching,_expression_tree::sequential>::constant
          (default_branch<float,_expression_tree::no_caching,_expression_tree::sequential> *this)

{
  bool bVar1;
  bool local_19;
  default_branch<float,_expression_tree::no_caching,_expression_tree::sequential> *this_local;
  
  if (this->constant_ == indeterminate) {
    bVar1 = node<float,_expression_tree::no_caching,_expression_tree::sequential>::constant
                      (&this->l);
    local_19 = false;
    if (bVar1) {
      local_19 = node<float,_expression_tree::no_caching,_expression_tree::sequential>::constant
                           (&this->r);
    }
    this->constant_ = local_19 == false;
  }
  return this->constant_ == true_;
}

Assistant:

virtual bool constant() const override
	{
        if(constant_ == indeterminate)
        {
            constant_ = (l.constant() && r.constant()) ? true_ : false_;
        }

		return constant_ == true_;
	}